

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericMouseInput.cpp
# Opt level: O3

void __thiscall fw::GenericMouseInput::nextFrame(GenericMouseInput *this)

{
  KeyState *pKVar1;
  KeyState KVar2;
  KeyState KVar3;
  KeyState KVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  
  lVar7 = 0;
  do {
    pKVar1 = this->_buttonStates + lVar7;
    KVar2 = pKVar1[1];
    KVar3 = pKVar1[2];
    KVar4 = pKVar1[3];
    if (*pKVar1 == Tapped) {
      this->_buttonStates[lVar7] = Pressed;
    }
    if (KVar2 == Tapped) {
      this->_buttonStates[lVar7 + 1] = Pressed;
    }
    if (KVar3 == Tapped) {
      this->_buttonStates[lVar7 + 2] = Pressed;
    }
    if (KVar4 == Tapped) {
      this->_buttonStates[lVar7 + 3] = Pressed;
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x20);
  dVar5 = (this->_currentPosition).field_0.field_0.y;
  (this->_previousPosition).field_0.field_0.x = (this->_currentPosition).field_0.field_0.x;
  (this->_previousPosition).field_0.field_0.y = dVar5;
  dVar5 = (this->_currentPosition).field_0.field_0.y;
  dVar6 = (this->_previousPosition).field_0.field_0.y;
  (this->_movement).field_0.field_0.x =
       (this->_currentPosition).field_0.field_0.x - (this->_previousPosition).field_0.field_0.x;
  (this->_movement).field_0.field_0.y = dVar5 - dVar6;
  return;
}

Assistant:

void GenericMouseInput::nextFrame()
{
    changeTapsToPresses();
    _previousPosition = _currentPosition;
    _movement = _currentPosition - _previousPosition;
}